

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::(anonymous_namespace)::SymbolByFullNameEq::operator()
          (void *this,Symbol *a,FullNameQuery *b)

{
  int iVar1;
  SymbolBase *__n;
  bool bVar2;
  string_view sVar3;
  
  sVar3 = Symbol::full_name((Symbol *)this);
  __n = (SymbolBase *)sVar3._M_len;
  if (__n == a->ptr_) {
    if (__n == (SymbolBase *)0x0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(sVar3._M_str,a[1].ptr_,(size_t)__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator()(const T& a, const U& b) const {
    return a.full_name() == b.full_name();
  }